

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O0

void __thiscall gui::SliderStyle::SliderStyle(SliderStyle *this,Gui *gui)

{
  Gui *in_RSI;
  Style *in_RDI;
  Style *size;
  RectangleShape *in_stack_ffffffffffffffd0;
  Vector2<float> local_18 [3];
  
  Style::Style(in_RDI,in_RSI);
  in_RDI->_vptr_Style = (_func_int **)&PTR__SliderStyle_004800a8;
  size = in_RDI + 1;
  sf::Vector2<float>::Vector2(local_18,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffffd0,(Vector2f *)size);
  sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xffffffffffffffd4,0.0,0.0);
  sf::RectangleShape::RectangleShape(in_stack_ffffffffffffffd0,(Vector2f *)size);
  sf::Color::Color((Color *)(in_RDI + 0x2c));
  sf::Color::Color((Color *)((long)&in_RDI[0x2c]._vptr_Style + 4));
  sf::Color::Color((Color *)&in_RDI[0x2c].gui_);
  sf::Color::Color((Color *)((long)&in_RDI[0x2c].gui_ + 4));
  return;
}

Assistant:

SliderStyle::SliderStyle(const Gui& gui) :
    Style(gui) {
}